

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::java::anon_unknown_0::GenerateGetBitInternal
                   (string *prefix,int bitIndex)

{
  int in_EDX;
  string *in_RDI;
  string mask;
  int bitInVarIndex;
  string varName;
  string *result;
  int in_stack_fffffffffffffedc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_f0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  string local_d0 [32];
  string local_b0 [38];
  undefined1 local_8a;
  undefined1 local_89 [33];
  int local_68;
  string local_58 [32];
  string local_38 [36];
  int local_14;
  
  local_14 = in_EDX;
  GetBitFieldNameForBit_abi_cxx11_(in_stack_fffffffffffffedc);
  std::operator+(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  std::__cxx11::string::~string(local_58);
  local_68 = local_14 % 0x20;
  __rhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
           (bit_masks + (long)local_68 * 8);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_89 + 1),(char *)__rhs,(allocator *)__lhs);
  std::allocator<char>::~allocator((allocator<char> *)local_89);
  local_8a = 0;
  std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::operator+(__lhs,(char *)__rhs);
  std::operator+(__lhs,__rhs);
  std::operator+(__lhs,(char *)__rhs);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_f0);
  local_8a = 1;
  std::__cxx11::string::~string((string *)(local_89 + 1));
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

std::string GenerateGetBitInternal(const std::string& prefix, int bitIndex) {
  std::string varName = prefix + GetBitFieldNameForBit(bitIndex);
  int bitInVarIndex = bitIndex % 32;

  std::string mask = bit_masks[bitInVarIndex];
  std::string result = "((" + varName + " & " + mask + ") != 0)";
  return result;
}